

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRenderer.cpp
# Opt level: O0

GdlRuleTable * __thiscall
GdlRenderer::GetRuleTable(GdlRenderer *this,GrpLineAndFile *lnf,string *staTableName)

{
  bool bVar1;
  GdlRuleTable *pGVar2;
  Symbol sta2;
  GrcSymbolTable *in_RDX;
  undefined8 in_RDI;
  Symbol psymTableName;
  GdlRuleTable *prultbl;
  Symbol in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  SymbolType in_stack_fffffffffffffeb4;
  GrcSymbolTableEntry *in_stack_fffffffffffffeb8;
  vector<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_> *in_stack_fffffffffffffec0;
  allocator *paVar3;
  string *this_00;
  GrcSymbolTable *this_01;
  int nID;
  GrcErrorList *this_02;
  GdlRenderer *in_stack_ffffffffffffff08;
  GrpLineAndFile *in_stack_ffffffffffffff10;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  string local_80 [32];
  Symbol local_60;
  undefined1 local_48 [64];
  GdlRuleTable *local_8;
  
  nID = (int)((ulong)in_RDI >> 0x20);
  this_02 = (GrcErrorList *)local_48;
  this_01 = in_RDX;
  std::__cxx11::string::string((string *)this_02,(string *)in_RDX);
  pGVar2 = FindRuleTable(in_stack_ffffffffffffff08,(string *)this_02);
  std::__cxx11::string::~string((string *)local_48);
  local_8 = pGVar2;
  if (pGVar2 == (GdlRuleTable *)0x0) {
    local_48._32_8_ = pGVar2;
    GrcManager::SymbolTable(&g_cman);
    this_00 = local_80;
    std::__cxx11::string::string(this_00,(string *)this_01);
    sta2 = GrcSymbolTable::FindSymbol(this_01,(string *)in_RDX);
    std::__cxx11::string::~string(local_80);
    local_60 = sta2;
    if ((sta2 == (Symbol)0x0) ||
       (bVar1 = GrcSymbolTableEntry::FitsSymbolType
                          (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4), !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"The ",&local_a1);
      std::__cxx11::string::string(local_c8,(string *)this_01);
      paVar3 = (allocator *)&stack0xffffffffffffff17;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8," table cannot hold rules",paVar3);
      GrcErrorList::AddError
                (this_02,nID,(GdlObject *)this_01,(string *)in_RDX,&sta2->m_staFieldName,
                 (string *)this_00,in_stack_ffffffffffffff10);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      local_8 = (GdlRuleTable *)0x0;
    }
    else {
      pGVar2 = (GdlRuleTable *)operator_new(0x50);
      GdlRuleTable::GdlRuleTable
                ((GdlRuleTable *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffea8);
      local_48._32_8_ = pGVar2;
      GdlObject::SetLineAndFile
                ((GdlObject *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (GrpLineAndFile *)in_stack_fffffffffffffea8);
      std::vector<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_>::push_back
                (in_stack_fffffffffffffec0,(value_type *)pGVar2);
      local_8 = (GdlRuleTable *)local_48._32_8_;
    }
  }
  return local_8;
}

Assistant:

GdlRuleTable * GdlRenderer::GetRuleTable(GrpLineAndFile & lnf, std::string staTableName)
{
	GdlRuleTable * prultbl = FindRuleTable(staTableName);

	if (prultbl)
		return prultbl;

	//	Create a new one, if permissible.

	Symbol psymTableName = g_cman.SymbolTable()->FindSymbol(staTableName);
	Assert(psymTableName);
	if (!psymTableName || !psymTableName->FitsSymbolType(ksymtTableRule))
	{
		g_errorList.AddError(2162, NULL,
			"The ",
			staTableName,
			" table cannot hold rules",
			lnf);
		return NULL;
	}

	prultbl = new GdlRuleTable(psymTableName);
	prultbl->SetLineAndFile(lnf);
	m_vprultbl.push_back(prultbl);

	return prultbl;
}